

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void>::visit
          (ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void> *this,Arg *arg)

{
  StringValue<char> SVar1;
  StringValue<wchar_t> SVar2;
  CustomValue CVar3;
  unkbyte10 *in_RSI;
  ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void> *in_RDI;
  undefined4 in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  undefined2 in_stack_ffffffffffffffa0;
  undefined6 in_stack_ffffffffffffffa2;
  undefined2 in_stack_ffffffffffffffa8;
  
  switch(*(undefined4 *)(in_RSI + 1)) {
  case 0:
  case 1:
    break;
  case 2:
    visit_int((ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void> *)
              CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
              in_stack_ffffffffffffff9c);
    break;
  case 3:
    visit_uint((ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void> *)
               CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
    break;
  case 4:
    visit_long_long((ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void> *)
                    CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
                    CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    break;
  case 5:
    visit_ulong_long((ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void> *)
                     CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
                     CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    break;
  case 6:
    visit_bool((ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void> *)
               CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
               SUB41(in_stack_ffffffffffffff9c >> 0x18,0));
    break;
  case 7:
    visit_char((ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void> *)
               CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
               in_stack_ffffffffffffff9c);
    break;
  case 8:
    visit_double((ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void> *)
                 CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
                 (double)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    break;
  case 9:
    visit_long_double(in_RDI,(longdouble)
                             CONCAT28(in_stack_ffffffffffffffa8,
                                      CONCAT62(in_stack_ffffffffffffffa2,
                                               (short)((unkuint10)*in_RSI >> 0x40))));
    break;
  case 10:
    visit_cstring((ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void> *)
                  CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
                  (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    break;
  case 0xb:
    SVar1.value._4_4_ = in_stack_ffffffffffffff9c;
    SVar1.value._0_4_ = in_stack_ffffffffffffff98;
    SVar1.size._0_2_ = in_stack_ffffffffffffffa0;
    SVar1.size._2_6_ = in_stack_ffffffffffffffa2;
    visit_string((ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void> *)0x16dc1d,SVar1);
    break;
  case 0xc:
    SVar2.value._4_4_ = in_stack_ffffffffffffff9c;
    SVar2.value._0_4_ = in_stack_ffffffffffffff98;
    SVar2.size._0_2_ = in_stack_ffffffffffffffa0;
    SVar2.size._2_6_ = in_stack_ffffffffffffffa2;
    visit_wstring((ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void> *)0x16dc49,SVar2);
    break;
  case 0xd:
    visit_pointer((ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void> *)
                  CONCAT62(in_stack_ffffffffffffffa2,in_stack_ffffffffffffffa0),
                  (void *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    break;
  case 0xe:
    CVar3.value._4_4_ = in_stack_ffffffffffffff9c;
    CVar3.value._0_4_ = in_stack_ffffffffffffff98;
    CVar3.format._0_2_ = in_stack_ffffffffffffffa0;
    CVar3.format._2_6_ = in_stack_ffffffffffffffa2;
    visit_custom((ArgVisitor<fmt::(anonymous_namespace)::CharConverter,_void> *)0x16dc89,CVar3);
  }
  return;
}

Assistant:

Result visit(const Arg &arg) {
    switch (arg.type) {
    case Arg::NONE:
    case Arg::NAMED_ARG:
      FMT_ASSERT(false, "invalid argument type");
      break;
    case Arg::INT:
      return FMT_DISPATCH(visit_int(arg.int_value));
    case Arg::UINT:
      return FMT_DISPATCH(visit_uint(arg.uint_value));
    case Arg::LONG_LONG:
      return FMT_DISPATCH(visit_long_long(arg.long_long_value));
    case Arg::ULONG_LONG:
      return FMT_DISPATCH(visit_ulong_long(arg.ulong_long_value));
    case Arg::BOOL:
      return FMT_DISPATCH(visit_bool(arg.int_value != 0));
    case Arg::CHAR:
      return FMT_DISPATCH(visit_char(arg.int_value));
    case Arg::DOUBLE:
      return FMT_DISPATCH(visit_double(arg.double_value));
    case Arg::LONG_DOUBLE:
      return FMT_DISPATCH(visit_long_double(arg.long_double_value));
    case Arg::CSTRING:
      return FMT_DISPATCH(visit_cstring(arg.string.value));
    case Arg::STRING:
      return FMT_DISPATCH(visit_string(arg.string));
    case Arg::WSTRING:
      return FMT_DISPATCH(visit_wstring(arg.wstring));
    case Arg::POINTER:
      return FMT_DISPATCH(visit_pointer(arg.pointer));
    case Arg::CUSTOM:
      return FMT_DISPATCH(visit_custom(arg.custom));
    }
    return Result();
  }